

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall duckdb::Vector::Initialize(Vector *this,bool initialize_to_zero,idx_t capacity)

{
  LogicalType *list_type;
  PhysicalType type;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  data_ptr_t __s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  VectorArrayBuffer *pVVar3;
  idx_t iVar4;
  idx_t iVar5;
  VectorBuffer *pVVar6;
  VectorArrayBuffer *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  unsigned_long local_38;
  
  p_Var1 = (this->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var1 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  list_type = &this->type;
  type = (this->type).physical_type_;
  if (type == LIST) {
    pVVar3 = (VectorArrayBuffer *)operator_new(0x48);
    VectorListBuffer::VectorListBuffer((VectorListBuffer *)pVVar3,list_type,capacity);
    local_48 = pVVar3;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorListBuffer*>
              (&_Stack_40,(VectorListBuffer *)pVVar3);
  }
  else if (type == ARRAY) {
    pVVar3 = (VectorArrayBuffer *)operator_new(0x48);
    VectorArrayBuffer::VectorArrayBuffer(pVVar3,list_type,capacity);
    local_48 = pVVar3;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorArrayBuffer*>
              (&_Stack_40,pVVar3);
  }
  else {
    if (type != STRUCT) goto LAB_00dd6d78;
    pVVar3 = (VectorArrayBuffer *)operator_new(0x48);
    VectorStructBuffer::VectorStructBuffer((VectorStructBuffer *)pVVar3,list_type,capacity);
    local_48 = pVVar3;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorStructBuffer*>
              (&_Stack_40,(VectorStructBuffer *)pVVar3);
  }
  _Var2._M_pi = _Stack_40._M_pi;
  pVVar3 = local_48;
  local_48 = (VectorArrayBuffer *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->auxiliary).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &pVVar3->super_VectorBuffer;
  (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
LAB_00dd6d78:
  iVar4 = GetTypeIdSize(type);
  if (iVar4 != 0) {
    iVar5 = GetTypeIdSize((this->type).physical_type_);
    local_38 = iVar5 * capacity;
    make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)&local_48,&local_38);
    _Var2._M_pi = _Stack_40._M_pi;
    pVVar3 = local_48;
    local_48 = (VectorArrayBuffer *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &pVVar3->super_VectorBuffer;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    pVVar6 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    __s = (pVVar6->data).pointer;
    this->data = __s;
    if (initialize_to_zero) {
      switchD_0105dc25::default(__s,0,iVar4 * capacity);
    }
  }
  if ((this->validity).super_TemplatedValidityMask<unsigned_long>.capacity < capacity) {
    ValidityMask::Resize(&this->validity,capacity);
  }
  return;
}

Assistant:

void Vector::Initialize(bool initialize_to_zero, idx_t capacity) {
	auxiliary.reset();
	validity.Reset();
	auto &type = GetType();
	auto internal_type = type.InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
	}
	auto type_size = GetTypeIdSize(internal_type);
	if (type_size > 0) {
		buffer = VectorBuffer::CreateStandardVector(type, capacity);
		data = buffer->GetData();
		if (initialize_to_zero) {
			memset(data, 0, capacity * type_size);
		}
	}

	if (capacity > validity.Capacity()) {
		validity.Resize(capacity);
	}
}